

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverRemap(Mvc_Cover_t *p,int *pVarsRem,int nVarsRem)

{
  Mvc_Cover_t *pCoverNew;
  Mvc_Cube_t *pMVar1;
  Mvc_List_t *pList;
  int _i_;
  int i;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover;
  int nVarsRem_local;
  int *pVarsRem_local;
  Mvc_Cover_t *p_local;
  
  pCoverNew = Mvc_CoverAlloc(p->pMem,nVarsRem);
  for (pCubeCopy = (p->lCubes).pHead; pCubeCopy != (Mvc_Cube_t *)0x0; pCubeCopy = pCubeCopy->pNext)
  {
    pMVar1 = Mvc_CubeAlloc(pCoverNew);
    if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 0) {
      pMVar1->pData[0] =
           0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
    }
    else if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 1) {
      pMVar1->pData[0] = 0xffffffff;
      *(uint *)&pMVar1->field_0x14 =
           0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
    }
    else {
      pMVar1->pData[*(uint *)&pMVar1->field_0x8 & 0xffffff] =
           0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
      pList._0_4_ = *(uint *)&pMVar1->field_0x8 & 0xffffff;
      while (pList._0_4_ = (uint)pList - 1, -1 < (int)(uint)pList) {
        pMVar1->pData[(int)(uint)pList] = 0xffffffff;
      }
    }
    if ((pCoverNew->lCubes).pHead == (Mvc_Cube_t *)0x0) {
      (pCoverNew->lCubes).pHead = pMVar1;
    }
    else {
      ((pCoverNew->lCubes).pTail)->pNext = pMVar1;
    }
    (pCoverNew->lCubes).pTail = pMVar1;
    pMVar1->pNext = (Mvc_Cube_t *)0x0;
    (pCoverNew->lCubes).nItems = (pCoverNew->lCubes).nItems + 1;
  }
  pList._4_4_ = 0;
  do {
    if (nVarsRem <= pList._4_4_) {
      return pCoverNew;
    }
    if (-1 < pVarsRem[pList._4_4_]) {
      if ((pVarsRem[pList._4_4_] < 0) || (p->nBits <= pVarsRem[pList._4_4_])) {
        __assert_fail("pVarsRem[i] >= 0 && pVarsRem[i] < p->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                      ,0x1a4,"Mvc_Cover_t *Mvc_CoverRemap(Mvc_Cover_t *, int *, int)");
      }
      Mvc_CoverCopyColumn(p,pCoverNew,pVarsRem[pList._4_4_],pList._4_4_);
    }
    pList._4_4_ = pList._4_4_ + 1;
  } while( true );
}

Assistant:

Mvc_Cover_t * Mvc_CoverRemap( Mvc_Cover_t * p, int * pVarsRem, int nVarsRem )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    int i;
    // clone the cover
    pCover = Mvc_CoverAlloc( p->pMem, nVarsRem );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeAlloc( pCover );
        //Mvc_CubeBitClean( pCubeCopy );   //changed by wjiang
        Mvc_CubeBitFill( pCubeCopy );      //changed by wjiang
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    // copy the corresponding columns
    for ( i = 0; i < nVarsRem; i++ )
    {
        if (pVarsRem[i] < 0) 
            continue;     //added by wjiang
        assert( pVarsRem[i] >= 0 && pVarsRem[i] < p->nBits );
        Mvc_CoverCopyColumn( p, pCover, pVarsRem[i], i );
    }
    return pCover;
}